

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::AddUTF8(SQLexer *this,SQUnsignedInteger ch)

{
  sqvector<char> *psVar1;
  byte bVar2;
  SQInteger SStack_30;
  byte local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  
  bVar2 = (byte)ch;
  if (ch < 0x80) {
    local_11 = bVar2;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_11);
    SStack_30 = 1;
  }
  else if (ch < 0x800) {
    local_12 = (byte)(ch >> 6) | 0xc0;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_12);
    local_13 = bVar2 & 0x3f | 0x80;
    sqvector<char>::push_back(&this->_longstr,(char *)&local_13);
    SStack_30 = 2;
  }
  else if (ch < 0x10000) {
    psVar1 = &this->_longstr;
    local_14 = (byte)(ch >> 0xc) | 0xe0;
    sqvector<char>::push_back(psVar1,(char *)&local_14);
    local_15 = (byte)(ch >> 6) & 0x3f | 0x80;
    sqvector<char>::push_back(psVar1,(char *)&local_15);
    local_16 = bVar2 & 0x3f | 0x80;
    sqvector<char>::push_back(psVar1,(char *)&local_16);
    SStack_30 = 3;
  }
  else if ("otIN9__gnu_cxx17__normal_iteratorIPN11snestistics6OpInfoESt6vectorIS3_SaIS3_EEEENS0_5__ops15_Iter_less_iterEET_SB_SB_T0_"
           < ch) {
    SStack_30 = 0;
  }
  else {
    psVar1 = &this->_longstr;
    local_17 = (byte)(ch >> 0x12) | 0xf0;
    sqvector<char>::push_back(psVar1,(char *)&local_17);
    local_18 = (byte)(ch >> 0xc) & 0x3f | 0x80;
    sqvector<char>::push_back(psVar1,(char *)&local_18);
    local_19 = (byte)(ch >> 6) & 0x3f | 0x80;
    sqvector<char>::push_back(psVar1,(char *)&local_19);
    local_1a = bVar2 & 0x3f | 0x80;
    sqvector<char>::push_back(psVar1,(char *)&local_1a);
    SStack_30 = 4;
  }
  return SStack_30;
}

Assistant:

SQInteger SQLexer::AddUTF8(SQUnsignedInteger ch)
{
    if (ch < 0x80) {
        APPEND_CHAR((char)ch);
        return 1;
    }
    if (ch < 0x800) {
        APPEND_CHAR((SQChar)((ch >> 6) | 0xC0));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 2;
    }
    if (ch < 0x10000) {
        APPEND_CHAR((SQChar)((ch >> 12) | 0xE0));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 3;
    }
    if (ch < 0x110000) {
        APPEND_CHAR((SQChar)((ch >> 18) | 0xF0));
        APPEND_CHAR((SQChar)(((ch >> 12) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 4;
    }
    return 0;
}